

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

lzma_ret lzma_lzma_encode(lzma_coder_conflict9 *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                         size_t out_size,uint32_t limit)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  uint uVar7;
  uint uVar8;
  lzma_lzma_state lVar9;
  lzma_lzma_state lVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  uint32_t len;
  uint32_t back;
  uint32_t local_88;
  uint local_84;
  size_t *local_80;
  probability *local_78;
  probability *local_70;
  probability *local_68;
  probability (*local_60) [16];
  size_t local_58;
  probability *local_50;
  probability (*local_48) [16];
  lzma_length_encoder *local_40;
  probability (*local_38) [768];
  
  local_58 = out_size;
  if (coder->is_initialized == false) {
    uVar3 = mf->read_pos;
    if (uVar3 != mf->read_ahead) {
      __assert_fail("mf_position(mf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x117,"_Bool encode_init(lzma_coder *, lzma_mf *)");
    }
    if (uVar3 == mf->read_limit) {
      if (mf->action == LZMA_RUN) {
        return LZMA_OK;
      }
      if (mf->write_pos != uVar3) {
        __assert_fail("mf->write_pos == mf->read_pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x11e,"_Bool encode_init(lzma_coder *, lzma_mf *)");
      }
      if (mf->action != LZMA_FINISH) {
        __assert_fail("mf->action == LZMA_FINISH",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x11f,"_Bool encode_init(lzma_coder *, lzma_mf *)");
      }
    }
    else {
      uVar15 = 1;
      (*mf->skip)(mf,1);
      mf->read_ahead = 0;
      sVar13 = (coder->rc).count;
      (coder->rc).symbols[sVar13] = RC_BIT_0;
      (coder->rc).probs[sVar13] = coder->is_match[0];
      (coder->rc).count = sVar13 + 1;
      bVar1 = *mf->buffer;
      uVar18 = 7;
      lVar14 = sVar13 + 0x23;
      do {
        lVar12 = lVar14;
        bVar19 = (bVar1 >> (uVar18 & 0x1f) & 1) != 0;
        *(uint *)((long)coder + lVar12 * 4 + -0x60) = (uint)bVar19;
        *(probability **)((coder->rc).symbols + lVar12 * 2 + -10) = coder->literal[0] + uVar15;
        uVar15 = (ulong)((uint)bVar19 + (int)uVar15 * 2);
        bVar19 = uVar18 != 0;
        uVar18 = uVar18 - 1;
        lVar14 = lVar12 + 1;
      } while (bVar19);
      (coder->rc).count = lVar12 - 0x21;
    }
    coder->is_initialized = true;
  }
  uVar18 = mf->read_pos - mf->read_ahead;
  local_60 = coder->is_match;
  local_68 = coder->is_rep;
  local_70 = coder->is_rep0;
  local_78 = coder->is_rep1;
  local_50 = coder->is_rep2;
  local_48 = coder->is_rep0_long;
  local_40 = &coder->rep_len_encoder;
  local_38 = coder->literal;
  do {
    _Var6 = rc_encode(&coder->rc,out,out_pos,local_58);
    if (_Var6) {
      iVar11 = 1;
      if (limit != 0xffffffff) {
        __assert_fail("limit == UINT32_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x159,
                      "lzma_ret lzma_lzma_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                     );
      }
    }
    else if ((limit == 0xffffffff) ||
            ((iVar11 = 3, mf->read_pos - mf->read_ahead < limit &&
             (*out_pos + (coder->rc).cache_size + 4 < 0xefff)))) {
      if (mf->read_pos < mf->read_limit) {
LAB_004f0764:
        if (coder->fast_mode == true) {
          lzma_lzma_optimum_fast(coder,mf,&local_84,&local_88);
        }
        else {
          lzma_lzma_optimum_normal(coder,mf,&local_84,&local_88,uVar18);
        }
        uVar3 = local_88;
        uVar15 = (ulong)local_84;
        uVar7 = coder->pos_mask & uVar18;
        if (uVar15 == 0xffffffff) {
          if (local_88 != 1) {
            __assert_fail("len == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                          ,0xfa,
                          "void encode_symbol(lzma_coder *, lzma_mf *, uint32_t, uint32_t, uint32_t)"
                         );
          }
          lVar10 = coder->state;
          sVar13 = (coder->rc).count;
          (coder->rc).symbols[sVar13] = RC_BIT_0;
          (coder->rc).probs[sVar13] = local_60[lVar10] + uVar7;
          (coder->rc).count = sVar13 + 1;
          uVar7 = mf->read_pos - mf->read_ahead;
          puVar5 = mf->buffer;
          bVar1 = (byte)coder->literal_context_bits;
          bVar2 = puVar5[uVar7];
          uVar17 = (uint)(puVar5[uVar7 - 1] >> (8 - bVar1 & 0x1f)) +
                   ((coder->literal_pos_mask & uVar18) << (bVar1 & 0x1f));
          if (coder->state < STATE_LIT_MATCH) {
            lVar14 = sVar13 + 0x23;
            uVar15 = 1;
            uVar7 = 7;
            do {
              bVar19 = (bVar2 >> (uVar7 & 0x1f) & 1) != 0;
              *(uint *)((long)coder + lVar14 * 4 + -0x60) = (uint)bVar19;
              *(probability **)((coder->rc).symbols + lVar14 * 2 + -10) = local_38[uVar17] + uVar15;
              uVar15 = (ulong)((uint)bVar19 + (int)uVar15 * 2);
              lVar14 = lVar14 + 1;
              bVar19 = uVar7 != 0;
              uVar7 = uVar7 - 1;
            } while (bVar19);
          }
          else {
            uVar7 = (uint)puVar5[uVar7 + ~coder->reps[0]];
            uVar8 = bVar2 | 0x100;
            lVar14 = sVar13 + 0x23;
            uVar16 = 0x100;
            do {
              uVar7 = uVar7 * 2;
              *(uint *)((long)coder + lVar14 * 4 + -0x60) = uVar8 >> 7 & 1;
              *(probability **)((coder->rc).symbols + lVar14 * 2 + -10) =
                   local_38[uVar17] + ((uVar8 >> 8) + uVar16 + (uVar7 & uVar16));
              uVar8 = uVar8 * 2;
              uVar16 = uVar16 & ~(uVar8 ^ uVar7);
              lVar14 = lVar14 + 1;
            } while (uVar8 < 0x10000);
          }
          (coder->rc).count = lVar14 - 0x22;
          lVar10 = coder->state;
          lVar9 = STATE_LIT_LIT;
          if (STATE_SHORTREP_LIT_LIT < lVar10) {
            if (lVar10 < STATE_NONLIT_MATCH) {
              lVar9 = lVar10 - STATE_SHORTREP_LIT_LIT;
            }
            else {
              lVar9 = lVar10 - STATE_SHORTREP_LIT;
            }
          }
          coder->state = lVar9;
        }
        else {
          lVar10 = coder->state;
          sVar13 = (coder->rc).count;
          (coder->rc).symbols[sVar13] = RC_BIT_1;
          (coder->rc).probs[sVar13] = local_60[lVar10] + uVar7;
          (coder->rc).count = sVar13 + 1;
          lVar10 = coder->state;
          if (local_84 < 4) {
            (coder->rc).symbols[sVar13 + 1] = RC_BIT_1;
            (coder->rc).probs[sVar13 + 1] = local_68 + lVar10;
            (coder->rc).count = sVar13 + 2;
            if (uVar15 == 0) {
              lVar10 = coder->state;
              (coder->rc).symbols[sVar13 + 2] = RC_BIT_0;
              (coder->rc).probs[sVar13 + 2] = local_70 + lVar10;
              (coder->rc).count = sVar13 + 3;
              lVar10 = coder->state;
              (coder->rc).symbols[sVar13 + 3] = (uint)(local_88 != 1);
              (coder->rc).probs[sVar13 + 3] = local_48[lVar10] + uVar7;
              (coder->rc).count = sVar13 + 4;
            }
            else {
              uVar4 = coder->reps[uVar15];
              lVar10 = coder->state;
              (coder->rc).symbols[sVar13 + 2] = RC_BIT_1;
              (coder->rc).probs[sVar13 + 2] = local_70 + lVar10;
              (coder->rc).count = sVar13 + 3;
              lVar10 = coder->state;
              if (uVar15 == 1) {
                (coder->rc).symbols[sVar13 + 3] = RC_BIT_0;
                (coder->rc).probs[sVar13 + 3] = local_78 + lVar10;
                (coder->rc).count = sVar13 + 4;
              }
              else {
                (coder->rc).symbols[sVar13 + 3] = RC_BIT_1;
                (coder->rc).probs[sVar13 + 3] = local_78 + lVar10;
                (coder->rc).count = sVar13 + 4;
                lVar10 = coder->state;
                (coder->rc).symbols[sVar13 + 4] = local_84 - RC_DIRECT_0;
                (coder->rc).probs[sVar13 + 4] = local_50 + lVar10;
                (coder->rc).count = sVar13 + 5;
                if (uVar15 == 3) {
                  coder->reps[3] = coder->reps[2];
                }
                coder->reps[2] = coder->reps[1];
              }
              coder->reps[1] = coder->reps[0];
              coder->reps[0] = uVar4;
            }
            if (local_88 == 1) {
              lVar10 = (uint)(STATE_SHORTREP_LIT < coder->state) * 2 + STATE_LIT_SHORTREP;
            }
            else {
              local_80 = out_pos;
              length(&coder->rc,local_40,uVar7,local_88,coder->fast_mode);
              lVar10 = (uint)(STATE_SHORTREP_LIT < coder->state) * 3 + STATE_LIT_LONGREP;
              out_pos = local_80;
            }
            coder->state = lVar10;
          }
          else {
            (coder->rc).symbols[sVar13 + 1] = RC_BIT_0;
            (coder->rc).probs[sVar13 + 1] = local_68 + lVar10;
            (coder->rc).count = sVar13 + 2;
            local_80 = (size_t *)CONCAT44(local_80._4_4_,limit);
            match(coder,uVar7,local_84 - 4,local_88);
            limit = (uint)local_80;
          }
        }
        if (mf->read_ahead < uVar3) {
          __assert_fail("mf->read_ahead >= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                        ,0x10f,
                        "void encode_symbol(lzma_coder *, lzma_mf *, uint32_t, uint32_t, uint32_t)")
          ;
        }
        mf->read_ahead = mf->read_ahead - uVar3;
        uVar18 = uVar18 + local_88;
        iVar11 = 0;
      }
      else if (mf->action == LZMA_RUN) {
        iVar11 = 1;
      }
      else {
        if (mf->read_ahead != 0) goto LAB_004f0764;
        iVar11 = 3;
      }
    }
    if (iVar11 != 0) {
      if (iVar11 != 3) {
        return LZMA_OK;
      }
      if (coder->is_flushed == false) {
        coder->is_flushed = true;
        if (limit == 0xffffffff) {
          uVar18 = uVar18 & coder->pos_mask;
          lVar10 = coder->state;
          sVar13 = (coder->rc).count;
          (coder->rc).symbols[sVar13] = RC_BIT_1;
          (coder->rc).probs[sVar13] = coder->is_match[lVar10] + uVar18;
          (coder->rc).count = sVar13 + 1;
          lVar10 = coder->state;
          (coder->rc).symbols[sVar13 + 1] = RC_BIT_0;
          (coder->rc).probs[sVar13 + 1] = coder->is_rep + lVar10;
          (coder->rc).count = sVar13 + 2;
          match(coder,uVar18,0xffffffff,2);
        }
        sVar13 = (coder->rc).count;
        lVar14 = 5;
        do {
          (coder->rc).symbols[sVar13] = RC_FLUSH;
          sVar13 = sVar13 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        (coder->rc).count = sVar13;
        _Var6 = rc_encode(&coder->rc,out,out_pos,local_58);
        if (_Var6) {
          if (limit == 0xffffffff) {
            return LZMA_OK;
          }
          __assert_fail("limit == UINT32_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                        ,0x194,
                        "lzma_ret lzma_lzma_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                       );
        }
      }
      coder->is_flushed = false;
      return LZMA_STREAM_END;
    }
  } while( true );
}

Assistant:

extern lzma_ret
lzma_lzma_encode(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size, uint32_t limit)
{
	uint32_t position;

	// Initialize the stream if no data has been encoded yet.
	if (!coder->is_initialized && !encode_init(coder, mf))
		return LZMA_OK;

	// Get the lowest bits of the uncompressed offset from the LZ layer.
	position = mf_position(mf);

	while (true) {
		uint32_t len;
		uint32_t back;

		// Encode pending bits, if any. Calling this before encoding
		// the next symbol is needed only with plain LZMA, since
		// LZMA2 always provides big enough buffer to flush
		// everything out from the range encoder. For the same reason,
		// rc_encode() never returns true when this function is used
		// as part of LZMA2 encoder.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}

		// With LZMA2 we need to take care that compressed size of
		// a chunk doesn't get too big.
		// FIXME? Check if this could be improved.
		if (limit != UINT32_MAX
				&& (mf->read_pos - mf->read_ahead >= limit
					|| *out_pos + rc_pending(&coder->rc)
						>= LZMA2_CHUNK_MAX
							- LOOP_INPUT_MAX))
			break;

		// Check that there is some input to process.
		if (mf->read_pos >= mf->read_limit) {
			if (mf->action == LZMA_RUN)
				return LZMA_OK;

			if (mf->read_ahead == 0)
				break;
		}

		// Get optimal match (repeat position and length).
		// Value ranges for pos:
		//   - [0, REP_DISTANCES): repeated match
		//   - [REP_DISTANCES, UINT32_MAX):
		//     match at (pos - REP_DISTANCES)
		//   - UINT32_MAX: not a match but a literal
		// Value ranges for len:
		//   - [MATCH_LEN_MIN, MATCH_LEN_MAX]

		if (coder->fast_mode)
			lzma_lzma_optimum_fast(coder, mf, &back, &len);
		else
			lzma_lzma_optimum_normal(
					coder, mf, &back, &len, position);

		encode_symbol(coder, mf, back, len, position);

		position += len;
	}

	if (!coder->is_flushed) {
		coder->is_flushed = true;

		// We don't support encoding plain LZMA streams without EOPM,
		// and LZMA2 doesn't use EOPM at LZMA level.
		if (limit == UINT32_MAX)
			encode_eopm(coder, position);

		// Flush the remaining bytes from the range encoder.
		rc_flush(&coder->rc);

		// Copy the remaining bytes to the output buffer. If there
		// isn't enough output space, we will copy out the remaining
		// bytes on the next call to this function by using
		// the rc_encode() call in the encoding loop above.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}
	}

	// Make it ready for the next LZMA2 chunk.
	coder->is_flushed = false;

	return LZMA_STREAM_END;
}